

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IAbstractReader.cpp
# Opt level: O2

int __thiscall IAbstractReader::readBase(IAbstractReader *this,string *str)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  str->_M_string_length = 0;
  *(str->_M_dataplus)._M_p = '\0';
  iVar1 = prepare(this);
  iVar2 = std::istream::tellg();
  (**this->_vptr_IAbstractReader)(this,str);
  iVar3 = (int)str->_M_string_length;
  iVar4 = 0;
  if (str->_M_string_length != 0) {
    iVar4 = iVar1 + iVar3;
  }
  setPos(this,iVar2 + iVar3);
  return iVar4;
}

Assistant:

int IAbstractReader::readBase(std::string& str) {
    int ret=0;
    str.clear();
    ret+=prepare();
    int base_pos = m_ifs->tellg();
    getWord(str);
    if(!str.length())
    {
        setPos(base_pos);
        return 0;
    }
    ret+=str.length();
    setPos(base_pos+str.length());
    return ret;
}